

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Maze.cpp
# Opt level: O0

void __thiscall Maze::printSolved(Maze *this)

{
  ostream *this_00;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  local_28;
  Maze *local_10;
  Maze *this_local;
  
  local_10 = this;
  if ((this->isSolved & 1U) == 0) {
    this_00 = std::operator<<((ostream *)&std::cout,"Not Solved");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  else {
    std::
    vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
    ::vector(&local_28,&this->solvedMatrix);
    printMatrix(this,&local_28);
    std::
    vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
    ::~vector(&local_28);
  }
  return;
}

Assistant:

void Maze::printSolved() {
    //prints the maze that is solved.
    if(isSolved){
        printMatrix(solvedMatrix);
    }
    else{
        std::cout <<"Not Solved"<<std::endl;
    }
}